

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t42(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  void *__s1;
  _Bool ok_19;
  _Bool ok_18;
  _Bool ok_17;
  _Bool ok_16;
  _Bool ok_15;
  _Bool ok_14;
  _Bool ok_13;
  _Bool ok_12;
  _Bool ok_11;
  _Bool ok_10;
  _Bool ok_9;
  _Bool ok_8;
  _Bool ok_7;
  _Bool ok_6;
  _Bool ok_5;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  ALLEGRO_USTR *us;
  
  uVar3 = al_ustr_new("abcdef");
  lVar4 = al_ustr_set_chr(uVar3,1,0x42);
  if (lVar4 == 1) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 1, \'B\') == 1");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 1, \'B\') == 1");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,"aBcdef");
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == strcmp(al_cstr(us), \"aBcdef\")");
  }
  else {
    log_printf("FAIL %s\n","0 == strcmp(al_cstr(us), \"aBcdef\")");
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 6) {
    log_printf("OK   %s\n","6 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","6 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,1,0x3b2);
  if (lVar4 == 2) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 1, U_beta) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 1, U_beta) == 2");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_1043);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_104f);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_104f);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 7) {
    log_printf("OK   %s\n","7 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","7 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,5,0x1d08);
  if (lVar4 == 3) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 5, U_1d08) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 5, U_1d08) == 3");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_1073);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_107f);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_107f);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 9) {
    log_printf("OK   %s\n","9 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","9 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,5,0x259);
  if (lVar4 == 2) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, 5, U_schwa) == 2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, 5, U_schwa) == 2");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_10a3);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_10af);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_10af);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 8) {
    log_printf("OK   %s\n","8 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","8 == al_ustr_size(us)");
    error = error + 1;
  }
  uVar2 = al_ustr_size(uVar3);
  lVar4 = al_ustr_set_chr(uVar3,uVar2,0x1ff7);
  if (lVar4 == 3) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, al_ustr_size(us), U_1ff7) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, al_ustr_size(us), U_1ff7) == 3");
    error = error + 1;
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar1 = strcmp(pcVar5,anon_var_dwarf_10d3);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_10df);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_10df);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 0xb) {
    log_printf("OK   %s\n","11 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","11 == al_ustr_size(us)");
    error = error + 1;
  }
  iVar1 = al_ustr_size(uVar3);
  lVar4 = al_ustr_set_chr(uVar3,iVar1 + 2,0x2051);
  if (lVar4 == 3) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, al_ustr_size(us) + 2, U_2051) == 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, al_ustr_size(us) + 2, U_2051) == 3");
    error = error + 1;
  }
  __s1 = (void *)al_cstr(uVar3);
  iVar1 = memcmp(__s1,anon_var_dwarf_1103,0x10);
  if (iVar1 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_110f);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_110f);
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 0x10) {
    log_printf("OK   %s\n","16 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","16 == al_ustr_size(us)");
    error = error + 1;
  }
  lVar4 = al_ustr_set_chr(uVar3,0xffffffff,0x2051);
  if (lVar4 == 0) {
    log_printf("OK   %s\n","al_ustr_set_chr(us, -1, U_2051) == 0");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_set_chr(us, -1, U_2051) == 0");
    error = error + 1;
  }
  lVar4 = al_ustr_size(uVar3);
  if (lVar4 == 0x10) {
    log_printf("OK   %s\n","16 == al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","16 == al_ustr_size(us)");
    error = error + 1;
  }
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t42(void)
{
   ALLEGRO_USTR *us = al_ustr_new("abcdef");

   /* Same size (ASCII). */
   CHECK(al_ustr_set_chr(us, 1, 'B') == 1);
   CHECK(0 == strcmp(al_cstr(us), "aBcdef"));
   CHECK(6 == al_ustr_size(us));

   /* Enlarge to 2-bytes. */
   CHECK(al_ustr_set_chr(us, 1, U_beta) == 2);
   CHECK(0 == strcmp(al_cstr(us), "aβcdef"));
   CHECK(7 == al_ustr_size(us));

   /* Enlarge to 3-bytes. */
   CHECK(al_ustr_set_chr(us, 5, U_1d08) == 3);
   CHECK(0 == strcmp(al_cstr(us), "aβcdᴈf"));
   CHECK(9 == al_ustr_size(us));

   /* Reduce to 2-bytes. */
   CHECK(al_ustr_set_chr(us, 5, U_schwa) == 2);
   CHECK(0 == strcmp(al_cstr(us), "aβcdəf"));
   CHECK(8 == al_ustr_size(us));

   /* Set at end of string. */
   CHECK(al_ustr_set_chr(us, al_ustr_size(us), U_1ff7) == 3);
   CHECK(0 == strcmp(al_cstr(us), "aβcdəfῷ"));
   CHECK(11 == al_ustr_size(us));

   /* Set past end of string. */
   CHECK(al_ustr_set_chr(us, al_ustr_size(us) + 2, U_2051) == 3);
   CHECK(0 == memcmp(al_cstr(us), "aβcdəfῷ\0\0⁑", 16));
   CHECK(16 == al_ustr_size(us));

   /* Set before start of string (not allowed). */
   CHECK(al_ustr_set_chr(us, -1, U_2051) == 0);
   CHECK(16 == al_ustr_size(us));

   al_ustr_free(us);
}